

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O1

int xmlTextAddContent(xmlNodePtr text,xmlChar *content,int len)

{
  xmlChar *content_00;
  int iVar1;
  
  iVar1 = 0;
  if (content != (xmlChar *)0x0) {
    content_00 = xmlStrncatNew(text->content,content,len);
    if (content_00 == (xmlChar *)0x0) {
      iVar1 = -1;
    }
    else {
      xmlTextSetContent(text,content_00);
      iVar1 = 0;
    }
  }
  return iVar1;
}

Assistant:

static int
xmlTextAddContent(xmlNodePtr text, const xmlChar *content, int len) {
    xmlChar *merged;

    if (content == NULL)
        return(0);

    merged = xmlStrncatNew(text->content, content, len);
    if (merged == NULL)
        return(-1);

    xmlTextSetContent(text, merged);
    return(0);
}